

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool __thiscall
testing::internal::TypedExpectation<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)>::
Matches(TypedExpectation<TestExprBuilder<4,_BasicTestExpr<2>_>_(mp::expr::Kind,_int)> *this,
       ArgumentTuple *args)

{
  bool bVar1;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<mp::expr::Kind>,testing::Matcher<int>>,std::tuple<mp::expr::Kind,int>>
                    ((tuple<testing::Matcher<mp::expr::Kind>,_testing::Matcher<int>_> *)
                     (this + 0xf0),args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<mp::expr::Kind,_int>_&>::Matches
                      ((MatcherBase<const_std::tuple<mp::expr::Kind,_int>_&> *)(this + 0x120),args);
    return bVar1;
  }
  return false;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }